

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O2

FIRSTPASS_STATS * read_frame_stats(TWO_PASS *p,TWO_PASS_FRAME *p_frame,int offset)

{
  FIRSTPASS_STATS *pFVar1;
  ulong uVar2;
  
  pFVar1 = p_frame->stats_in;
  if (offset < 0) {
    uVar2 = (ulong)offset;
    if (pFVar1 + uVar2 < p->stats_buf_ctx->stats_in_start) {
      return (FIRSTPASS_STATS *)0x0;
    }
  }
  else {
    uVar2 = (ulong)(uint)offset;
    if (p->stats_buf_ctx->stats_in_end <= pFVar1 + uVar2) {
      return (FIRSTPASS_STATS *)0x0;
    }
  }
  return pFVar1 + uVar2;
}

Assistant:

static const FIRSTPASS_STATS *read_frame_stats(const TWO_PASS *p,
                                               const TWO_PASS_FRAME *p_frame,
                                               int offset) {
  if ((offset >= 0 &&
       p_frame->stats_in + offset >= p->stats_buf_ctx->stats_in_end) ||
      (offset < 0 &&
       p_frame->stats_in + offset < p->stats_buf_ctx->stats_in_start)) {
    return NULL;
  }

  return &p_frame->stats_in[offset];
}